

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  int iVar1;
  AlphaNum *this_00;
  AlphaNum *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i_1;
  EnumValueDescriptor *value_descriptor;
  int j;
  EnumDescriptor *in_stack_00000128;
  Generator *in_stack_00000130;
  EnumDescriptor *enum_descriptor;
  int i;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  value_type *in_stack_fffffffffffffe78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  AlphaNum *in_stack_fffffffffffffeb8;
  Printer *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  char (*in_stack_fffffffffffffee0) [5];
  char *in_stack_fffffffffffffee8;
  Printer *in_stack_fffffffffffffef0;
  string local_100 [32];
  string local_e0 [32];
  int local_c0;
  int local_bc;
  EnumValueDescriptor *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar3;
  string local_80 [32];
  string local_60 [32];
  AlphaNum *local_40;
  int local_24;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_20;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x4bb669);
  local_24 = 0;
  while( true ) {
    iVar3 = local_24;
    iVar1 = FileDescriptor::enum_type_count
                      ((FileDescriptor *)in_RDI[1].field_2._M_allocated_capacity);
    if (iVar1 <= iVar3) break;
    in_stack_fffffffffffffeb8 =
         (AlphaNum *)
         FileDescriptor::enum_type
                   ((FileDescriptor *)in_RDI[1].field_2._M_allocated_capacity,local_24);
    local_40 = in_stack_fffffffffffffeb8;
    PrintEnum(in_stack_00000130,in_stack_00000128);
    EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)local_40);
    anon_unknown_0::ResolveKeyword((string *)in_stack_fffffffffffffeb8);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((Generator *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (EnumDescriptor *)in_stack_ffffffffffffff70);
    io::Printer::Print<char[5],std::__cxx11::string,char[16],std::__cxx11::string>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,&in_stack_fffffffffffffed0->variable_delimiter_,in_RDI);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    io::Printer::Print<>(in_stack_fffffffffffffed0,(char *)in_RDI);
    iVar3 = 0;
    while( true ) {
      in_stack_ffffffffffffff7c = iVar3;
      iVar1 = EnumDescriptor::value_count((EnumDescriptor *)local_40);
      if (iVar1 <= iVar3) break;
      in_stack_ffffffffffffff70 =
           EnumDescriptor::value((EnumDescriptor *)local_40,in_stack_ffffffffffffff7c);
      in_stack_fffffffffffffe90 = EnumValueDescriptor::name_abi_cxx11_(in_stack_ffffffffffffff70);
      local_bc = EnumValueDescriptor::number(in_stack_ffffffffffffff70);
      std::make_pair<std::__cxx11::string_const&,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_bc,in_stack_fffffffffffffe88),(int *)in_stack_fffffffffffffe80);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x4bb867);
      iVar3 = in_stack_ffffffffffffff7c + 1;
    }
    local_24 = local_24 + 1;
  }
  local_c0 = 0;
  while( true ) {
    this_00 = (AlphaNum *)(long)local_c0;
    pAVar2 = (AlphaNum *)
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::size(&local_20);
    if (pAVar2 <= this_00) break;
    iVar3 = (int)((ulong)*(undefined8 *)((long)&in_RDI[2].field_2 + 8) >> 0x20);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator[](&local_20,(long)local_c0);
    anon_unknown_0::ResolveKeyword((string *)in_stack_fffffffffffffeb8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator[](&local_20,(long)local_c0);
    strings::AlphaNum::AlphaNum(this_00,iVar3);
    StrCat_abi_cxx11_(in_stack_fffffffffffffeb8);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,&in_stack_fffffffffffffed0->variable_delimiter_,in_RDI);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
    local_c0 = local_c0 + 1;
  }
  io::Printer::Print<>(in_stack_fffffffffffffed0,(char *)in_RDI);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  std::vector<std::pair<std::string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print(
        "$name$ = "
        "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
        "name", ResolveKeyword(enum_descriptor.name()), "descriptor_name",
        ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          std::make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n", "name",
                    ResolveKeyword(top_level_enum_values[i].first), "value",
                    StrCat(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}